

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<chaiscript::File_Position>::
handle<chaiscript::File_Position,void>
          (Handle_Return<chaiscript::File_Position> *this,File_Position *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<chaiscript::File_Position> local_28;
  File_Position *local_18;
  File_Position *r_local;
  
  local_18 = r;
  r_local = (File_Position *)this;
  std::make_shared<chaiscript::File_Position,chaiscript::File_Position>((File_Position *)&local_28);
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::File_Position>,void>
            ((Boxed_Value *)this,&local_28,true);
  Catch::clara::std::shared_ptr<chaiscript::File_Position>::~shared_ptr(&local_28);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }